

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O3

bool __thiscall
QCommandLineParserPrivate::registerFoundOption(QCommandLineParserPrivate *this,QString *optionName)

{
  Data<QHashPrivate::Node<QString,_long_long>_> *this_00;
  Node<QString,_long_long> *pNVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  QList<QString> *this_01;
  
  this_00 = (this->nameHash).d;
  if (this_00 != (Data<QHashPrivate::Node<QString,_long_long>_> *)0x0) {
    pNVar1 = QHashPrivate::Data<QHashPrivate::Node<QString,_long_long>_>::findNode<QString>
                       (this_00,optionName);
    if (pNVar1 != (Node<QString,_long_long> *)0x0) {
      bVar3 = true;
      lVar2 = 0x50;
      lVar4 = 0x40;
      goto LAB_0016752a;
    }
  }
  lVar2 = 0x80;
  lVar4 = 0x70;
  bVar3 = false;
LAB_0016752a:
  this_01 = (QList<QString> *)((long)&(this->errorText).d.d + lVar4);
  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
            ((QMovableArrayOps<QString> *)this_01,
             *(qsizetype *)((long)&(this->errorText).d.d + lVar2),optionName);
  QList<QString>::end(this_01);
  return bVar3;
}

Assistant:

bool QCommandLineParserPrivate::registerFoundOption(const QString &optionName)
{
    if (nameHash.contains(optionName)) {
        optionNames.append(optionName);
        return true;
    } else {
        unknownOptionNames.append(optionName);
        return false;
    }
}